

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O0

void __thiscall intel_acbp_v1_t::ibbs_body_t::_read(ibbs_body_t *this)

{
  uint8_t uVar1;
  byte bVar2;
  uint32_t uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer this_01;
  uint64_t uVar4;
  hash_t *phVar5;
  vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
  *this_02;
  pointer this_03;
  ibb_segment_t *this_04;
  unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>
  local_60;
  int local_58;
  uint local_54;
  int i_1;
  int l_ibb_segments;
  unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_> local_48 [3];
  unique_ptr<intel_acbp_v1_t::hash_t,std::default_delete<intel_acbp_v1_t::hash_t>> local_30 [15];
  uint8_t local_21;
  int local_20;
  undefined4 local_1c;
  int i;
  int l_reserved;
  ibbs_body_t *local_10;
  ibbs_body_t *this_local;
  
  local_10 = this;
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00);
  std::
  unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&i,this_00);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&this->m_reserved,
              (unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&i);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&i);
  local_1c = 3;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    this_01 = std::
              unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator->(&this->m_reserved);
    local_21 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this_01,&local_21);
  }
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_flags = uVar3;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_mch_bar = uVar4;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_vtd_bar = uVar4;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_dma_protection_base0 = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_dma_protection_limit0 = uVar3;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_dma_protection_base1 = uVar4;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_dma_protection_limit1 = uVar4;
  phVar5 = (hash_t *)operator_new(0x48);
  hash_t::hash_t(phVar5,(this->super_kstruct).m__io,&this->super_kstruct,this->m__root);
  std::unique_ptr<intel_acbp_v1_t::hash_t,std::default_delete<intel_acbp_v1_t::hash_t>>::
  unique_ptr<std::default_delete<intel_acbp_v1_t::hash_t>,void>(local_30,phVar5);
  std::unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>::operator=
            (&this->m_post_ibb_hash,
             (unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_> *)
             local_30);
  std::unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>::
  ~unique_ptr((unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_> *)
              local_30);
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_ibb_entry_point = uVar3;
  phVar5 = (hash_t *)operator_new(0x48);
  hash_t::hash_t(phVar5,(this->super_kstruct).m__io,&this->super_kstruct,this->m__root);
  std::unique_ptr<intel_acbp_v1_t::hash_t,std::default_delete<intel_acbp_v1_t::hash_t>>::
  unique_ptr<std::default_delete<intel_acbp_v1_t::hash_t>,void>
            ((unique_ptr<intel_acbp_v1_t::hash_t,std::default_delete<intel_acbp_v1_t::hash_t>> *)
             local_48,phVar5);
  std::unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>::operator=
            (&this->m_ibb_hash,local_48);
  std::unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>::
  ~unique_ptr(local_48);
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_num_ibb_segments = uVar1;
  this_02 = (vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
             *)operator_new(0x18);
  memset(this_02,0,0x18);
  std::
  vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
  ::vector(this_02);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>>>
              *)&i_1,this_02);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
  ::operator=(&this->m_ibb_segments,
              (unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
               *)&i_1);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
                 *)&i_1);
  bVar2 = num_ibb_segments(this);
  local_54 = (uint)bVar2;
  for (local_58 = 0; local_58 < (int)local_54; local_58 = local_58 + 1) {
    this_03 = std::
              unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
              ::operator->(&this->m_ibb_segments);
    this_04 = (ibb_segment_t *)operator_new(0x30);
    ibb_segment_t::ibb_segment_t(this_04,(this->super_kstruct).m__io,this,this->m__root);
    std::
    unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>::
    unique_ptr<std::default_delete<intel_acbp_v1_t::ibb_segment_t>,void>
              ((unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>
                *)&local_60,this_04);
    std::
    vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
    ::push_back(this_03,(value_type *)&local_60);
    std::
    unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>
    ::~unique_ptr(&local_60);
  }
  return;
}

Assistant:

void intel_acbp_v1_t::ibbs_body_t::_read() {
    m_reserved = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    const int l_reserved = 3;
    for (int i = 0; i < l_reserved; i++) {
        m_reserved->push_back(std::move(m__io->read_u1()));
    }
    m_flags = m__io->read_u4le();
    m_mch_bar = m__io->read_u8le();
    m_vtd_bar = m__io->read_u8le();
    m_dma_protection_base0 = m__io->read_u4le();
    m_dma_protection_limit0 = m__io->read_u4le();
    m_dma_protection_base1 = m__io->read_u8le();
    m_dma_protection_limit1 = m__io->read_u8le();
    m_post_ibb_hash = std::unique_ptr<hash_t>(new hash_t(m__io, this, m__root));
    m_ibb_entry_point = m__io->read_u4le();
    m_ibb_hash = std::unique_ptr<hash_t>(new hash_t(m__io, this, m__root));
    m_num_ibb_segments = m__io->read_u1();
    m_ibb_segments = std::unique_ptr<std::vector<std::unique_ptr<ibb_segment_t>>>(new std::vector<std::unique_ptr<ibb_segment_t>>());
    const int l_ibb_segments = num_ibb_segments();
    for (int i = 0; i < l_ibb_segments; i++) {
        m_ibb_segments->push_back(std::move(std::unique_ptr<ibb_segment_t>(new ibb_segment_t(m__io, this, m__root))));
    }
}